

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O0

exr_result_t
exr_attr_chlist_add(exr_context_t ctxt,exr_attr_chlist_t *clist,char *name,exr_pixel_type_t ptype,
                   exr_perceptual_treatment_t islinear,int32_t xsamp,int32_t ysamp)

{
  exr_result_t eVar1;
  char *in_RDX;
  int32_t len;
  exr_perceptual_treatment_t in_stack_0000003c;
  int32_t in_stack_00000044;
  char *in_stack_00000048;
  exr_attr_chlist_t *in_stack_00000050;
  exr_context_t in_stack_00000058;
  int32_t in_stack_00000070;
  int32_t in_stack_00000078;
  
  if (in_RDX != (char *)0x0) {
    strlen(in_RDX);
  }
  eVar1 = exr_attr_chlist_add_with_length
                    (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000044,ysamp,
                     in_stack_0000003c,in_stack_00000070,in_stack_00000078);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_chlist_add (
    exr_context_t              ctxt,
    exr_attr_chlist_t*         clist,
    const char*                name,
    exr_pixel_type_t           ptype,
    exr_perceptual_treatment_t islinear,
    int32_t                    xsamp,
    int32_t                    ysamp)
{
    int32_t len = 0;
    if (name) len = (int32_t) strlen (name);
    return exr_attr_chlist_add_with_length (
        ctxt, clist, name, len, ptype, islinear, xsamp, ysamp);
}